

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<bool,iutest::TestFlag::Fragment<8192>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,bool *expected,Fragment<8192> *actual)

{
  bool *actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  internal *local_30;
  Fragment<8192> *actual_local;
  bool *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = (internal *)expected;
  actual_local = (Fragment<8192> *)actual_str;
  expected_local = (bool *)expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<iutest::TestFlag::Fragment<8192>,bool>
                    ((Fragment<8192> *)expected,(bool *)actual_str);
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<bool,iutest::TestFlag::Fragment<8192>>
              (&local_50,(internal *)actual_local,(bool *)local_30,(Fragment<8192> *)actual_str);
    FormatForComparisonFailureMessage<iutest::TestFlag::Fragment<8192>,bool>
              (&local_70,local_30,actual_local,(bool *)actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,actual_expression,&local_50,&local_70,false
             );
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }